

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseInputs(void)

{
  float *pfVar1;
  bool bVar2;
  float fVar3;
  float rhs;
  ImVec2 delta_from_click_pos_1;
  ImVec2 delta_from_click_pos;
  int i;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff98;
  float local_5c;
  float local_54;
  float local_48;
  float local_44;
  bool local_3e;
  bool local_3d;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c;
  int local_24;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  bVar2 = IsMousePosValid(&(GImGui->IO).MousePos);
  if (bVar2) {
    local_10 = ImFloor(in_stack_ffffffffffffff98);
    local_8->LastValidMousePos = local_10;
    (local_8->IO).MousePos = local_8->LastValidMousePos;
  }
  bVar2 = IsMousePosValid(&(local_8->IO).MousePos);
  if ((bVar2) && (bVar2 = IsMousePosValid(&(local_8->IO).MousePosPrev), bVar2)) {
    local_18 = operator-(in_stack_ffffffffffffff98,(ImVec2 *)0x13325a);
    (local_8->IO).MouseDelta = local_18;
  }
  else {
    ImVec2::ImVec2(&local_20,0.0,0.0);
    (local_8->IO).MouseDelta = local_20;
  }
  fVar3 = (local_8->IO).MouseDelta.x;
  if ((((fVar3 != 0.0) || (NAN(fVar3))) || (fVar3 = (local_8->IO).MouseDelta.y, fVar3 != 0.0)) ||
     (NAN(fVar3))) {
    local_8->NavDisableMouseHover = false;
  }
  (local_8->IO).MousePosPrev = (local_8->IO).MousePos;
  for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
    local_3d = false;
    if (((local_8->IO).MouseDown[local_24] & 1U) != 0) {
      pfVar1 = (local_8->IO).MouseDownDuration + local_24;
      local_3d = *pfVar1 <= 0.0 && *pfVar1 != 0.0;
    }
    (local_8->IO).MouseClicked[local_24] = local_3d;
    local_3e = false;
    if (((local_8->IO).MouseDown[local_24] & 1U) == 0) {
      local_3e = 0.0 <= (local_8->IO).MouseDownDuration[local_24];
    }
    (local_8->IO).MouseReleased[local_24] = local_3e;
    (local_8->IO).MouseDownDurationPrev[local_24] = (local_8->IO).MouseDownDuration[local_24];
    if (((local_8->IO).MouseDown[local_24] & 1U) == 0) {
      local_48 = -1.0;
    }
    else {
      pfVar1 = (local_8->IO).MouseDownDuration + local_24;
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        local_44 = (local_8->IO).MouseDownDuration[local_24] + (local_8->IO).DeltaTime;
      }
      else {
        local_44 = 0.0;
      }
      local_48 = local_44;
    }
    (local_8->IO).MouseDownDuration[local_24] = local_48;
    (local_8->IO).MouseDoubleClicked[local_24] = false;
    if (((local_8->IO).MouseClicked[local_24] & 1U) == 0) {
      if (((local_8->IO).MouseDown[local_24] & 1U) != 0) {
        bVar2 = IsMousePosValid(&(local_8->IO).MousePos);
        if (bVar2) {
          local_3c = operator-(in_stack_ffffffffffffff98,(ImVec2 *)0x133673);
        }
        else {
          ImVec2::ImVec2(&local_3c,0.0,0.0);
        }
        fVar3 = (local_8->IO).MouseDragMaxDistanceSqr[local_24];
        rhs = ImLengthSqr(&local_3c);
        fVar3 = ImMax<float>(fVar3,rhs);
        (local_8->IO).MouseDragMaxDistanceSqr[local_24] = fVar3;
        if (0.0 <= local_3c.x) {
          local_54 = local_3c.x;
        }
        else {
          local_54 = -local_3c.x;
        }
        fVar3 = ImMax<float>((local_8->IO).MouseDragMaxDistanceAbs[local_24].x,local_54);
        (local_8->IO).MouseDragMaxDistanceAbs[local_24].x = fVar3;
        if (0.0 <= local_3c.y) {
          local_5c = local_3c.y;
        }
        else {
          local_5c = -local_3c.y;
        }
        fVar3 = ImMax<float>((local_8->IO).MouseDragMaxDistanceAbs[local_24].y,local_5c);
        (local_8->IO).MouseDragMaxDistanceAbs[local_24].y = fVar3;
      }
    }
    else {
      if ((local_8->IO).MouseDoubleClickTime <=
          (float)(local_8->Time - (local_8->IO).MouseClickedTime[local_24])) {
        (local_8->IO).MouseClickedTime[local_24] = local_8->Time;
      }
      else {
        bVar2 = IsMousePosValid(&(local_8->IO).MousePos);
        if (bVar2) {
          local_2c = operator-(in_stack_ffffffffffffff98,(ImVec2 *)0x1334ee);
        }
        else {
          ImVec2::ImVec2(&local_2c,0.0,0.0);
        }
        fVar3 = ImLengthSqr(&local_2c);
        if (fVar3 < (local_8->IO).MouseDoubleClickMaxDist * (local_8->IO).MouseDoubleClickMaxDist) {
          (local_8->IO).MouseDoubleClicked[local_24] = true;
        }
        (local_8->IO).MouseClickedTime[local_24] =
             (double)(-(local_8->IO).MouseDoubleClickTime * 2.0);
      }
      (local_8->IO).MouseClickedPos[local_24] = (local_8->IO).MousePos;
      (local_8->IO).MouseDownWasDoubleClick[local_24] =
           (bool)((local_8->IO).MouseDoubleClicked[local_24] & 1);
      ImVec2::ImVec2(&local_34,0.0,0.0);
      (local_8->IO).MouseDragMaxDistanceAbs[local_24] = local_34;
      (local_8->IO).MouseDragMaxDistanceSqr[local_24] = 0.0;
    }
    if ((((local_8->IO).MouseDown[local_24] & 1U) == 0) &&
       (((local_8->IO).MouseReleased[local_24] & 1U) == 0)) {
      (local_8->IO).MouseDownWasDoubleClick[local_24] = false;
    }
    if (((local_8->IO).MouseClicked[local_24] & 1U) != 0) {
      local_8->NavDisableMouseHover = false;
    }
  }
  return;
}

Assistant:

static void ImGui::UpdateMouseInputs()
{
    ImGuiContext& g = *GImGui;

    // Round mouse position to avoid spreading non-rounded position (e.g. UpdateManualResize doesn't support them well)
    if (IsMousePosValid(&g.IO.MousePos))
        g.IO.MousePos = g.LastValidMousePos = ImFloor(g.IO.MousePos);

    // If mouse just appeared or disappeared (usually denoted by -FLT_MAX components) we cancel out movement in MouseDelta
    if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MousePosPrev))
        g.IO.MouseDelta = g.IO.MousePos - g.IO.MousePosPrev;
    else
        g.IO.MouseDelta = ImVec2(0.0f, 0.0f);
    if (g.IO.MouseDelta.x != 0.0f || g.IO.MouseDelta.y != 0.0f)
        g.NavDisableMouseHover = false;

    g.IO.MousePosPrev = g.IO.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        g.IO.MouseClicked[i] = g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] < 0.0f;
        g.IO.MouseReleased[i] = !g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] >= 0.0f;
        g.IO.MouseDownDurationPrev[i] = g.IO.MouseDownDuration[i];
        g.IO.MouseDownDuration[i] = g.IO.MouseDown[i] ? (g.IO.MouseDownDuration[i] < 0.0f ? 0.0f : g.IO.MouseDownDuration[i] + g.IO.DeltaTime) : -1.0f;
        g.IO.MouseDoubleClicked[i] = false;
        if (g.IO.MouseClicked[i])
        {
            if ((float)(g.Time - g.IO.MouseClickedTime[i]) < g.IO.MouseDoubleClickTime)
            {
                ImVec2 delta_from_click_pos = IsMousePosValid(&g.IO.MousePos) ? (g.IO.MousePos - g.IO.MouseClickedPos[i]) : ImVec2(0.0f, 0.0f);
                if (ImLengthSqr(delta_from_click_pos) < g.IO.MouseDoubleClickMaxDist * g.IO.MouseDoubleClickMaxDist)
                    g.IO.MouseDoubleClicked[i] = true;
                g.IO.MouseClickedTime[i] = -g.IO.MouseDoubleClickTime * 2.0f; // Mark as "old enough" so the third click isn't turned into a double-click
            }
            else
            {
                g.IO.MouseClickedTime[i] = g.Time;
            }
            g.IO.MouseClickedPos[i] = g.IO.MousePos;
            g.IO.MouseDownWasDoubleClick[i] = g.IO.MouseDoubleClicked[i];
            g.IO.MouseDragMaxDistanceAbs[i] = ImVec2(0.0f, 0.0f);
            g.IO.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (g.IO.MouseDown[i])
        {
            // Maintain the maximum distance we reaching from the initial click position, which is used with dragging threshold
            ImVec2 delta_from_click_pos = IsMousePosValid(&g.IO.MousePos) ? (g.IO.MousePos - g.IO.MouseClickedPos[i]) : ImVec2(0.0f, 0.0f);
            g.IO.MouseDragMaxDistanceSqr[i] = ImMax(g.IO.MouseDragMaxDistanceSqr[i], ImLengthSqr(delta_from_click_pos));
            g.IO.MouseDragMaxDistanceAbs[i].x = ImMax(g.IO.MouseDragMaxDistanceAbs[i].x, delta_from_click_pos.x < 0.0f ? -delta_from_click_pos.x : delta_from_click_pos.x);
            g.IO.MouseDragMaxDistanceAbs[i].y = ImMax(g.IO.MouseDragMaxDistanceAbs[i].y, delta_from_click_pos.y < 0.0f ? -delta_from_click_pos.y : delta_from_click_pos.y);
        }
        if (!g.IO.MouseDown[i] && !g.IO.MouseReleased[i])
            g.IO.MouseDownWasDoubleClick[i] = false;
        if (g.IO.MouseClicked[i]) // Clicking any mouse button reactivate mouse hovering which may have been deactivated by gamepad/keyboard navigation
            g.NavDisableMouseHover = false;
    }
}